

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ping-pong.c
# Opt level: O2

void tcp_pinger_v6_new(int vectored_writes)

{
  int iVar1;
  int *piVar2;
  undefined8 uVar3;
  char *__format;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  int64_t eval_b;
  int64_t eval_a;
  sockaddr_in6 server_addr;
  
  iVar1 = uv_ip6_addr("::1",0x23a3,&server_addr);
  eval_a = (int64_t)iVar1;
  if (eval_a == 0) {
    piVar2 = (int *)malloc(0x168);
    if (piVar2 == (int *)0x0) {
      pcVar5 = "!=";
      pcVar7 = "!=";
      eval_a = 0;
      pcVar6 = "NULL";
      __format = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
      pcVar4 = "pinger";
      uVar3 = 0xdf;
      goto LAB_0015dac6;
    }
    *piVar2 = vectored_writes;
    piVar2[1] = 0;
    piVar2[2] = 0;
    *(char **)(piVar2 + 0x58) = PING;
    uVar3 = uv_default_loop();
    iVar1 = uv_tcp_init(uVar3,piVar2 + 4);
    *(int **)(piVar2 + 4) = piVar2;
    eval_a = (int64_t)iVar1;
    if (eval_a == 0) {
      iVar1 = uv_tcp_connect(piVar2 + 0x3e,piVar2 + 4,&server_addr,pinger_on_connect);
      eval_a = (int64_t)iVar1;
      if (eval_a == 0) {
        eval_a = (int64_t)pinger_on_connect_count;
        if (eval_a == 0) {
          return;
        }
        pcVar4 = "pinger_on_connect_count";
        uVar3 = 0xf3;
      }
      else {
        pcVar4 = "r";
        uVar3 = 0xf0;
      }
    }
    else {
      pcVar4 = "r";
      uVar3 = 0xe8;
    }
  }
  else {
    pcVar4 = "uv_ip6_addr(\"::1\", 9123, &server_addr)";
    uVar3 = 0xdd;
  }
  pcVar5 = "==";
  __format = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
  pcVar7 = "==";
  pcVar6 = "0";
LAB_0015dac6:
  fprintf(_stderr,__format,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ping-pong.c"
          ,uVar3,pcVar4,pcVar5,pcVar6,eval_a,pcVar7,0);
  abort();
}

Assistant:

static void tcp_pinger_v6_new(int vectored_writes) {
  int r;
  struct sockaddr_in6 server_addr;
  pinger_t* pinger;


  ASSERT_OK(uv_ip6_addr("::1", TEST_PORT, &server_addr));
  pinger = malloc(sizeof(*pinger));
  ASSERT_NOT_NULL(pinger);
  pinger->vectored_writes = vectored_writes;
  pinger->state = 0;
  pinger->pongs = 0;
  pinger->pong = PING;

  /* Try to connect to the server and do NUM_PINGS ping-pongs. */
  r = uv_tcp_init(uv_default_loop(), &pinger->stream.tcp);
  pinger->stream.tcp.data = pinger;
  ASSERT_OK(r);

  /* We are never doing multiple reads/connects at a time anyway, so these
   * handles can be pre-initialized. */
  r = uv_tcp_connect(&pinger->connect_req,
                     &pinger->stream.tcp,
                     (const struct sockaddr*) &server_addr,
                     pinger_on_connect);
  ASSERT_OK(r);

  /* Synchronous connect callbacks are not allowed. */
  ASSERT_OK(pinger_on_connect_count);
}